

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nussinov.cpp
# Opt level: O0

tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall Nussinov::nussinov_abi_cxx11_(Nussinov *this,ostream *fout)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  int extraout_EAX_09;
  int extraout_EAX_10;
  int extraout_EAX_11;
  int extraout_EAX_12;
  int extraout_EAX_13;
  int extraout_EAX_14;
  int extraout_EAX_15;
  int extraout_EAX_16;
  ostream *poVar5;
  reference pvVar6;
  double *pdVar7;
  __tuple_element_t<2UL,_tuple<int,_int,_double>_> *p_Var8;
  vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_> *pvVar9;
  __tuple_element_t<0UL,_tuple<int,_int,_double>_> *p_Var10;
  __tuple_element_t<1UL,_tuple<int,_int,_double>_> *p_Var11;
  ulong uVar12;
  void *pvVar13;
  ostream *in_RDX;
  long in_RSI;
  tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  long time_take;
  time_point end;
  string rna;
  string bp;
  int k_2;
  int k_1;
  int q_5;
  int n_codon_c_1;
  int k;
  int c_1;
  int q_4;
  int n_codon_bp_3;
  int p_5;
  int n_codon_an_4;
  int q_3;
  int p_4;
  int n_codon_c;
  int n_codon_cn;
  int c;
  int q_2;
  int n_codon_bp_2;
  int p_3;
  int n_codon_an_3;
  int p_2;
  int n_codon_an_2;
  int q_1;
  int p_1;
  int n_codon_bp_1;
  int n_codon_an_1;
  int q;
  int n_codon_bp;
  int p;
  int n_codon_an;
  int y;
  int x_1;
  int j_1;
  int i_1;
  int n_codon_b;
  int n_codon_a_1;
  int b_1;
  int a_1;
  int len;
  int x;
  int j;
  int i;
  int l;
  int n_codon_a;
  int b;
  int a;
  double local_max;
  double ret;
  double ans;
  time_point start;
  int in_stack_00000548;
  int in_stack_0000054c;
  int in_stack_00000550;
  int in_stack_00000554;
  Nussinov *in_stack_00000558;
  int in_stack_00000570;
  int in_stack_00000578;
  int in_stack_00000580;
  int in_stack_fffffffffffffba8;
  __tuple_element_t<0UL,_tuple<int,_int,_double>_> _Var14;
  __tuple_element_t<1UL,_tuple<int,_int,_double>_> _Var15;
  int in_stack_fffffffffffffbac;
  int in_stack_fffffffffffffbb0;
  __tuple_element_t<1UL,_tuple<int,_int,_double>_> j_00;
  int in_stack_fffffffffffffbb4;
  int in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbbc;
  Nussinov *in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbd0;
  duration<long,_std::ratio<1L,_1L>_> local_248;
  long local_240;
  undefined8 local_238;
  string local_220 [32];
  string local_200 [80];
  double local_1b0;
  int local_1a4;
  double local_1a0;
  int local_194;
  double local_190;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  double local_178;
  double local_170;
  int local_168;
  int local_164;
  double local_160;
  int local_158;
  int local_154;
  double local_150;
  int local_144;
  int local_140;
  value_type local_13c;
  value_type local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  double local_120;
  double local_118;
  int local_110;
  int local_10c;
  double local_108;
  int local_100;
  int local_fc;
  value_type local_f8;
  value_type local_f4;
  double local_f0;
  double local_e8;
  int local_e0;
  int local_dc;
  double local_d8;
  double local_d0;
  int local_c8;
  int local_c4;
  double local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  value_type local_a4;
  value_type local_a0;
  uint local_9c;
  int local_98;
  int local_94;
  double local_60;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  value_type local_44;
  uint local_40;
  uint local_3c;
  double local_38;
  double local_30;
  double local_28;
  undefined8 local_20;
  ostream *local_18;
  
  local_18 = in_RDX;
  local_20 = std::chrono::_V2::system_clock::now();
  poVar5 = std::operator<<(local_18,"Nussinov");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_28 = 0.0;
  local_30 = 0.0;
  local_38 = 0.0;
  for (local_3c = 0; (int)local_3c < *(int *)(in_RSI + 0x30); local_3c = local_3c + 1) {
    local_40 = local_3c;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),(long)(int)local_3c);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&n_codon,(long)*pvVar6);
    local_44 = *pvVar6;
    for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
      for (local_4c = 0; local_4c + local_48 < 3; local_4c = local_4c + 1) {
        local_50 = local_4c + local_48;
        iVar3 = sigma(local_40,local_50);
        iVar4 = sigma(local_3c,local_4c);
        if (*(int *)(in_RSI + 0x34) < iVar3 - iVar4) {
          for (local_54 = 0; local_54 < local_44; local_54 = local_54 + 1) {
            local_30 = 0.0;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),
                                (long)(int)local_3c);
            iVar3 = nucleotides[*pvVar6][local_54][local_4c];
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),
                                (long)(int)local_40);
            bVar2 = complementary(iVar3,nucleotides[*pvVar6][local_54][local_50]);
            if ((((bVar2) && (local_4c < 2)) && (0 < local_50)) && (local_4c < local_50 + -1)) {
              in_stack_fffffffffffffba8 = local_54;
              pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                              in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                              in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                              (int)in_stack_fffffffffffffbd0);
              local_60 = *pdVar7 + 1.0;
              pdVar7 = std::max<double>(&local_30,&local_60);
              local_30 = *pdVar7;
            }
            if ((local_4c < 2) && (local_4c + 1 <= local_50)) {
              in_stack_fffffffffffffba8 = local_54;
              pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                              in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                              in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                              (int)in_stack_fffffffffffffbd0);
              pdVar7 = std::max<double>(&local_30,pdVar7);
              local_30 = *pdVar7;
            }
            if ((0 < local_50) && (local_4c <= local_50 + -1)) {
              in_stack_fffffffffffffba8 = local_54;
              pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                              in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                              in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                              (int)in_stack_fffffffffffffbd0);
              pdVar7 = std::max<double>(&local_30,pdVar7);
              local_30 = *pdVar7;
            }
            dVar1 = local_30;
            m((void *)(ulong)*(uint *)(in_RSI + 0x30),local_3c,(char *)(ulong)local_40,local_4c,
              local_50);
            std::
            vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
            operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                        *)(in_RSI + 0x38),(long)extraout_EAX);
            p_Var8 = std::get<2ul,int,int,double>((tuple<int,_int,_double> *)0x1354df);
            if (*p_Var8 <= dVar1 && dVar1 != *p_Var8) {
              std::make_tuple<int&,int&,double&>
                        ((int *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                         (int *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                         (double *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
              m((void *)(ulong)*(uint *)(in_RSI + 0x30),local_3c,(char *)(ulong)local_40,local_4c,
                local_50);
              std::
              vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
              operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                          *)(in_RSI + 0x38),(long)extraout_EAX_00);
              std::tuple<int,_int,_double>::operator=
                        ((tuple<int,_int,_double> *)
                         CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                         (type)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
            }
            dVar1 = local_30;
            m((void *)(ulong)*(uint *)(in_RSI + 0x30),local_3c,(char *)(ulong)local_40,local_4c,
              local_50);
            std::
            vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
            operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                        *)(in_RSI + 0x50),(long)extraout_EAX_01);
            p_Var8 = std::get<2ul,int,int,double>((tuple<int,_int,_double> *)0x1355e2);
            if (*p_Var8 <= dVar1 && dVar1 != *p_Var8) {
              std::make_tuple<int&,int&,double&>
                        ((int *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                         (int *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                         (double *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
              m((void *)(ulong)*(uint *)(in_RSI + 0x30),local_3c,(char *)(ulong)local_40,local_4c,
                local_50);
              std::
              vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
              operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                          *)(in_RSI + 0x50),(long)extraout_EAX_02);
              std::tuple<int,_int,_double>::operator=
                        ((tuple<int,_int,_double> *)
                         CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                         (type)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
            }
            dVar1 = local_30;
            m((void *)(ulong)*(uint *)(in_RSI + 0x30),local_3c,(char *)(ulong)local_40,local_4c,
              local_50);
            std::
            vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
            operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                        *)(in_RSI + 0x68),(long)extraout_EAX_03);
            p_Var8 = std::get<2ul,int,int,double>((tuple<int,_int,_double> *)0x1356e7);
            if (*p_Var8 <= dVar1 && dVar1 != *p_Var8) {
              std::make_tuple<int&,int&,double&>
                        ((int *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                         (int *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                         (double *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
              m((void *)(ulong)*(uint *)(in_RSI + 0x30),local_3c,(char *)(ulong)local_40,local_4c,
                local_50);
              std::
              vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
              operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                          *)(in_RSI + 0x68),(long)extraout_EAX_04);
              std::tuple<int,_int,_double>::operator=
                        ((tuple<int,_int,_double> *)
                         CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                         (type)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
            }
            dVar1 = local_30;
            in_stack_fffffffffffffba8 = local_54;
            pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                            in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                            in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                            (int)in_stack_fffffffffffffbd0);
            *pdVar7 = dVar1;
          }
        }
      }
    }
  }
  for (local_94 = 1; local_94 < *(int *)(in_RSI + 0x30); local_94 = local_94 + 1) {
    for (local_98 = 0; local_98 + local_94 < *(int *)(in_RSI + 0x30); local_98 = local_98 + 1) {
      local_9c = local_98 + local_94;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),(long)local_98);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&n_codon,(long)*pvVar6);
      local_a0 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),(long)(int)local_9c);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&n_codon,(long)*pvVar6);
      local_a4 = *pvVar6;
      for (local_a8 = 2; -1 < local_a8; local_a8 = local_a8 + -1) {
        for (local_ac = 0; local_ac < 3; local_ac = local_ac + 1) {
          iVar3 = sigma(local_9c,local_ac);
          iVar4 = sigma(local_98,local_a8);
          if (*(int *)(in_RSI + 0x34) < iVar3 - iVar4) {
            for (local_b0 = 0; local_b0 < local_a0; local_b0 = local_b0 + 1) {
              for (local_b4 = 0; local_b4 < local_a4; local_b4 = local_b4 + 1) {
                local_30 = 0.0;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),
                                    (long)local_98);
                iVar3 = nucleotides[*pvVar6][local_b0][local_a8];
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),
                                    (long)(int)local_9c);
                bVar2 = complementary(iVar3,nucleotides[*pvVar6][local_b4][local_ac]);
                if (bVar2) {
                  if ((local_a8 < 2) && (0 < local_ac)) {
                    in_stack_fffffffffffffba8 = local_b4;
                    pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                    in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                    in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                    (int)in_stack_fffffffffffffbd0);
                    local_c0 = *pdVar7 + 1.0;
                    pdVar7 = std::max<double>(&local_30,&local_c0);
                    local_30 = *pdVar7;
                  }
                  if ((local_a8 == 2) && (0 < local_ac)) {
                    if (local_98 + 1 < (int)local_9c) {
                      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),
                                          (long)(local_98 + 1));
                      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                         (&n_codon,(long)*pvVar6);
                      local_c4 = *pvVar6;
                      local_38 = 0.0;
                      for (local_c8 = 0; local_c8 < local_c4; local_c8 = local_c8 + 1) {
                        in_stack_fffffffffffffba8 = local_b4;
                        pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                        in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                        in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                        (int)in_stack_fffffffffffffbd0);
                        pdVar7 = std::max<double>(&local_38,pdVar7);
                        local_38 = *pdVar7;
                      }
                      local_d0 = local_38 + 1.0;
                      pdVar7 = std::max<double>(&local_30,&local_d0);
                      local_30 = *pdVar7;
                    }
                    if (local_98 + 1U == local_9c) {
                      in_stack_fffffffffffffba8 = local_b4;
                      pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                      in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                      in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                      (int)in_stack_fffffffffffffbd0);
                      local_d8 = *pdVar7 + 1.0;
                      pdVar7 = std::max<double>(&local_30,&local_d8);
                      local_30 = *pdVar7;
                    }
                  }
                  if ((local_a8 < 2) && (local_ac == 0)) {
                    if (local_98 < (int)(local_9c - 1)) {
                      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),
                                          (long)(int)(local_9c - 1));
                      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                         (&n_codon,(long)*pvVar6);
                      local_dc = *pvVar6;
                      local_38 = 0.0;
                      for (local_e0 = 0; local_e0 < local_dc; local_e0 = local_e0 + 1) {
                        in_stack_fffffffffffffba8 = local_e0;
                        pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                        in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                        in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                        (int)in_stack_fffffffffffffbd0);
                        pdVar7 = std::max<double>(&local_38,pdVar7);
                        local_38 = *pdVar7;
                      }
                      local_e8 = local_38 + 1.0;
                      pdVar7 = std::max<double>(&local_30,&local_e8);
                      local_30 = *pdVar7;
                    }
                    if (local_98 == local_9c - 1) {
                      in_stack_fffffffffffffba8 = local_b0;
                      pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                      in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                      in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                      (int)in_stack_fffffffffffffbd0);
                      local_f0 = *pdVar7 + 1.0;
                      pdVar7 = std::max<double>(&local_30,&local_f0);
                      local_30 = *pdVar7;
                    }
                  }
                  if ((local_a8 == 2) && (local_ac == 0)) {
                    if (local_98 + 1 < (int)(local_9c - 1)) {
                      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),
                                          (long)(local_98 + 1));
                      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                         (&n_codon,(long)*pvVar6);
                      local_f4 = *pvVar6;
                      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),
                                          (long)(int)(local_9c - 1));
                      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                         (&n_codon,(long)*pvVar6);
                      local_f8 = *pvVar6;
                      local_38 = 0.0;
                      for (local_fc = 0; local_fc < local_f4; local_fc = local_fc + 1) {
                        for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
                          in_stack_fffffffffffffba8 = local_100;
                          pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                          in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                          in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                          (int)in_stack_fffffffffffffbd0);
                          pdVar7 = std::max<double>(&local_38,pdVar7);
                          local_38 = *pdVar7;
                        }
                      }
                      local_108 = local_38 + 1.0;
                      pdVar7 = std::max<double>(&local_30,&local_108);
                      local_30 = *pdVar7;
                    }
                    if (local_98 + 1 == local_9c - 1) {
                      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),
                                          (long)(local_98 + 1));
                      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                         (&n_codon,(long)*pvVar6);
                      local_10c = *pvVar6;
                      local_38 = 0.0;
                      for (local_110 = 0; local_110 < local_10c; local_110 = local_110 + 1) {
                        in_stack_fffffffffffffba8 = local_110;
                        pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                        in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                        in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                        (int)in_stack_fffffffffffffbd0);
                        pdVar7 = std::max<double>(&local_38,pdVar7);
                        local_38 = *pdVar7;
                      }
                      local_118 = local_38 + 1.0;
                      pdVar7 = std::max<double>(&local_30,&local_118);
                      local_30 = *pdVar7;
                    }
                    iVar3 = sigma(local_9c,local_ac);
                    iVar4 = sigma(local_98,local_a8);
                    if (iVar3 + -1 == iVar4 + *(int *)(in_RSI + 0x34)) {
                      local_120 = 1.0;
                      pdVar7 = std::max<double>(&local_30,&local_120);
                      local_30 = *pdVar7;
                    }
                  }
                }
                if (local_a8 < 2) {
                  in_stack_fffffffffffffba8 = local_b4;
                  pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                  in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                  in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                  (int)in_stack_fffffffffffffbd0);
                  pdVar7 = std::max<double>(&local_30,pdVar7);
                  local_30 = *pdVar7;
                }
                if (0 < local_ac) {
                  in_stack_fffffffffffffba8 = local_b4;
                  pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                  in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                  in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                  (int)in_stack_fffffffffffffbd0);
                  pdVar7 = std::max<double>(&local_30,pdVar7);
                  local_30 = *pdVar7;
                }
                if (local_a8 == 2) {
                  if (local_98 + 1 < (int)local_9c) {
                    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),
                                        (long)(local_98 + 1));
                    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                       (&n_codon,(long)*pvVar6);
                    local_124 = *pvVar6;
                    for (local_128 = 0; local_128 < local_124; local_128 = local_128 + 1) {
                      in_stack_fffffffffffffba8 = local_b4;
                      pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                      in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                      in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                      (int)in_stack_fffffffffffffbd0);
                      pdVar7 = std::max<double>(&local_30,pdVar7);
                      local_30 = *pdVar7;
                    }
                  }
                  if (local_98 + 1U == local_9c) {
                    in_stack_fffffffffffffba8 = local_b4;
                    pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                    in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                    in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                    (int)in_stack_fffffffffffffbd0);
                    pdVar7 = std::max<double>(&local_30,pdVar7);
                    local_30 = *pdVar7;
                  }
                }
                if (local_ac == 0) {
                  if (local_98 < (int)(local_9c - 1)) {
                    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),
                                        (long)(int)(local_9c - 1));
                    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                       (&n_codon,(long)*pvVar6);
                    local_12c = *pvVar6;
                    for (local_130 = 0; local_130 < local_12c; local_130 = local_130 + 1) {
                      in_stack_fffffffffffffba8 = local_130;
                      pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                      in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                      in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                      (int)in_stack_fffffffffffffbd0);
                      pdVar7 = std::max<double>(&local_30,pdVar7);
                      local_30 = *pdVar7;
                    }
                  }
                  if (local_98 == local_9c - 1) {
                    in_stack_fffffffffffffba8 = local_b0;
                    pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                    in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                    in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                    (int)in_stack_fffffffffffffbd0);
                    pdVar7 = std::max<double>(&local_30,pdVar7);
                    local_30 = *pdVar7;
                  }
                }
                iVar3 = local_98;
                if (local_98 < (int)(local_9c - 2)) {
                  while (local_134 = iVar3 + 1, local_134 < (int)(local_9c - 1)) {
                    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),
                                        (long)(iVar3 + 2));
                    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                       (&n_codon,(long)*pvVar6);
                    local_138 = *pvVar6;
                    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),
                                        (long)local_134);
                    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                       (&n_codon,(long)*pvVar6);
                    local_13c = *pvVar6;
                    for (local_140 = 0; iVar3 = local_134, local_140 < local_138;
                        local_140 = local_140 + 1) {
                      for (local_144 = 0; local_144 < local_13c; local_144 = local_144 + 1) {
                        pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                        in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                        in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                        (int)in_stack_fffffffffffffbd0);
                        dVar1 = *pdVar7;
                        in_stack_fffffffffffffba8 = local_b4;
                        pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                        in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                        in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                        (int)in_stack_fffffffffffffbd0);
                        local_150 = dVar1 + *pdVar7;
                        pdVar7 = std::max<double>(&local_30,&local_150);
                        local_30 = *pdVar7;
                      }
                    }
                  }
                }
                if ((local_98 < (int)(local_9c - 1)) && (local_a8 < 3)) {
                  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),
                                      (long)(local_98 + 1));
                  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&n_codon,(long)*pvVar6);
                  local_154 = *pvVar6;
                  for (local_158 = 0; local_158 < local_154; local_158 = local_158 + 1) {
                    pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                    in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                    in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                    (int)in_stack_fffffffffffffbd0);
                    dVar1 = *pdVar7;
                    in_stack_fffffffffffffba8 = local_b4;
                    pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                    in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                    in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                    (int)in_stack_fffffffffffffbd0);
                    local_160 = dVar1 + *pdVar7;
                    pdVar7 = std::max<double>(&local_30,&local_160);
                    local_30 = *pdVar7;
                  }
                }
                if ((local_98 < (int)(local_9c - 1)) && (-1 < local_ac)) {
                  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),
                                      (long)(int)(local_9c - 1));
                  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&n_codon,(long)*pvVar6);
                  local_164 = *pvVar6;
                  for (local_168 = 0; local_168 < local_164; local_168 = local_168 + 1) {
                    pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                    in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                    in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                    (int)in_stack_fffffffffffffbd0);
                    dVar1 = *pdVar7;
                    in_stack_fffffffffffffba8 = local_b4;
                    pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                    in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                    in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                    (int)in_stack_fffffffffffffbd0);
                    local_170 = dVar1 + *pdVar7;
                    pdVar7 = std::max<double>(&local_30,&local_170);
                    local_30 = *pdVar7;
                  }
                }
                if (((local_98 == local_9c - 1) && (local_a8 < 3)) && (-1 < local_ac)) {
                  pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                  in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                  in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                  (int)in_stack_fffffffffffffbd0);
                  dVar1 = *pdVar7;
                  in_stack_fffffffffffffba8 = local_b4;
                  pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                  in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                  in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                  (int)in_stack_fffffffffffffbd0);
                  local_178 = dVar1 + *pdVar7;
                  pdVar7 = std::max<double>(&local_30,&local_178);
                  local_30 = *pdVar7;
                }
                iVar3 = local_98;
                if (local_98 < (int)(local_9c - 1)) {
                  while (local_17c = iVar3 + 1, local_17c < (int)local_9c) {
                    for (local_180 = 0; iVar3 = local_17c, local_180 < 2; local_180 = local_180 + 1)
                    {
                      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x18),
                                          (long)local_17c);
                      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                         (&n_codon,(long)*pvVar6);
                      local_184 = *pvVar6;
                      for (local_188 = 0; local_188 < local_184; local_188 = local_188 + 1) {
                        pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                        in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                        in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                        (int)in_stack_fffffffffffffbd0);
                        dVar1 = *pdVar7;
                        in_stack_fffffffffffffba8 = local_b4;
                        pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                        in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                        in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                        (int)in_stack_fffffffffffffbd0);
                        local_190 = dVar1 + *pdVar7;
                        pdVar7 = std::max<double>(&local_30,&local_190);
                        local_30 = *pdVar7;
                      }
                    }
                  }
                }
                if ((local_98 < (int)local_9c) && (local_a8 < 2)) {
                  for (local_194 = local_a8; local_194 < 2; local_194 = local_194 + 1) {
                    pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                    in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                    in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                    (int)in_stack_fffffffffffffbd0);
                    dVar1 = *pdVar7;
                    in_stack_fffffffffffffba8 = local_b4;
                    pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                    in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                    in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                    (int)in_stack_fffffffffffffbd0);
                    local_1a0 = dVar1 + *pdVar7;
                    pdVar7 = std::max<double>(&local_30,&local_1a0);
                    local_30 = *pdVar7;
                  }
                }
                if ((local_98 < (int)local_9c) && (0 < local_ac)) {
                  for (local_1a4 = 0; local_1a4 <= local_ac + -1; local_1a4 = local_1a4 + 1) {
                    pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                    in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                    in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                    (int)in_stack_fffffffffffffbd0);
                    dVar1 = *pdVar7;
                    in_stack_fffffffffffffba8 = local_b4;
                    pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                    in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                    in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                    (int)in_stack_fffffffffffffbd0);
                    local_1b0 = dVar1 + *pdVar7;
                    pdVar7 = std::max<double>(&local_30,&local_1b0);
                    local_30 = *pdVar7;
                  }
                }
                dVar1 = local_30;
                m((void *)(ulong)*(uint *)(in_RSI + 0x30),local_98,(char *)(ulong)local_9c,local_a8,
                  local_ac);
                std::
                vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                ::operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                              *)(in_RSI + 0x38),(long)extraout_EAX_05);
                p_Var8 = std::get<2ul,int,int,double>((tuple<int,_int,_double> *)0x136eff);
                if (*p_Var8 <= dVar1 && dVar1 != *p_Var8) {
                  std::make_tuple<int&,int&,double&>
                            ((int *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                             (int *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                             (double *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                            );
                  m((void *)(ulong)*(uint *)(in_RSI + 0x30),local_98,(char *)(ulong)local_9c,
                    local_a8,local_ac);
                  std::
                  vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                  ::operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                                *)(in_RSI + 0x38),(long)extraout_EAX_06);
                  std::tuple<int,_int,_double>::operator=
                            ((tuple<int,_int,_double> *)
                             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                             (type)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
                }
                dVar1 = local_30;
                m((void *)(ulong)*(uint *)(in_RSI + 0x30),local_98,(char *)(ulong)local_9c,local_a8,
                  local_ac);
                std::
                vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                ::operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                              *)(in_RSI + 0x50),(long)extraout_EAX_07);
                p_Var8 = std::get<2ul,int,int,double>((tuple<int,_int,_double> *)0x137007);
                if (*p_Var8 <= dVar1 && dVar1 != *p_Var8) {
                  std::make_tuple<int&,int&,double&>
                            ((int *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                             (int *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                             (double *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                            );
                  m((void *)(ulong)*(uint *)(in_RSI + 0x30),local_98,(char *)(ulong)local_9c,
                    local_a8,local_ac);
                  std::
                  vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                  ::operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                                *)(in_RSI + 0x50),(long)extraout_EAX_08);
                  std::tuple<int,_int,_double>::operator=
                            ((tuple<int,_int,_double> *)
                             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                             (type)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
                }
                dVar1 = local_30;
                m((void *)(ulong)*(uint *)(in_RSI + 0x30),local_98,(char *)(ulong)local_9c,local_a8,
                  local_ac);
                std::
                vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                ::operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                              *)(in_RSI + 0x68),(long)extraout_EAX_09);
                p_Var8 = std::get<2ul,int,int,double>((tuple<int,_int,_double> *)0x137111);
                if (*p_Var8 <= dVar1 && dVar1 != *p_Var8) {
                  std::make_tuple<int&,int&,double&>
                            ((int *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                             (int *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                             (double *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                            );
                  m((void *)(ulong)*(uint *)(in_RSI + 0x30),local_98,(char *)(ulong)local_9c,
                    local_a8,local_ac);
                  std::
                  vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                  ::operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                                *)(in_RSI + 0x68),(long)extraout_EAX_10);
                  std::tuple<int,_int,_double>::operator=
                            ((tuple<int,_int,_double> *)
                             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                             (type)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
                }
                dVar1 = local_30;
                in_stack_fffffffffffffba8 = local_b4;
                pdVar7 = Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                                in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                                (int)in_stack_fffffffffffffbd0);
                *pdVar7 = dVar1;
                pdVar7 = std::max<double>(&local_28,&local_30);
                local_28 = *pdVar7;
              }
            }
          }
        }
      }
    }
  }
  pvVar9 = (vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_> *)
           (in_RSI + 0x38);
  m((void *)(ulong)*(uint *)(in_RSI + 0x30),0,(char *)(ulong)(*(uint *)(in_RSI + 0x30) - 1),0,2);
  std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
  operator[](pvVar9,(long)extraout_EAX_11);
  std::get<0ul,int,int,double>((tuple<int,_int,_double> *)0x13731e);
  m((void *)(ulong)*(uint *)(in_RSI + 0x30),0,(char *)(ulong)(*(uint *)(in_RSI + 0x30) - 1),0,2);
  std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
  operator[](pvVar9,(long)extraout_EAX_12);
  std::get<1ul,int,int,double>((tuple<int,_int,_double> *)0x13736f);
  find_bp_abi_cxx11_(in_stack_00000558,in_stack_00000554,in_stack_00000550,in_stack_0000054c,
                     in_stack_00000548,in_stack_00000570,in_stack_00000578,in_stack_00000580);
  m((void *)(ulong)*(uint *)(in_RSI + 0x30),0,(char *)(ulong)(*(uint *)(in_RSI + 0x30) - 1),0,2);
  std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
  operator[](pvVar9,(long)extraout_EAX_13);
  p_Var10 = std::get<0ul,int,int,double>((tuple<int,_int,_double> *)0x137412);
  _Var14 = *p_Var10;
  m((void *)(ulong)*(uint *)(in_RSI + 0x30),0,(char *)(ulong)(*(uint *)(in_RSI + 0x30) - 1),0,2);
  std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
  operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_> *
             )(in_RSI + 0x38),(long)extraout_EAX_14);
  p_Var11 = std::get<1ul,int,int,double>((tuple<int,_int,_double> *)0x137479);
  j_00 = *p_Var11;
  iVar3 = 1;
  find_bp_abi_cxx11_(in_stack_00000558,in_stack_00000554,in_stack_00000550,in_stack_0000054c,
                     in_stack_00000548,in_stack_00000570,in_stack_00000578,in_stack_00000580);
  poVar5 = std::operator<<(local_18,"corresponding base pairs: ");
  poVar5 = std::operator<<(poVar5,local_200);
  poVar5 = std::operator<<(poVar5,",length: ");
  uVar12 = std::__cxx11::string::size();
  pvVar13 = (void *)std::ostream::operator<<(poVar5,uVar12);
  std::ostream::operator<<(pvVar13,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(local_18,"corresponding rna: ");
  poVar5 = std::operator<<(poVar5,local_220);
  poVar5 = std::operator<<(poVar5,",size: ");
  uVar12 = std::__cxx11::string::size();
  pvVar13 = (void *)std::ostream::operator<<(poVar5,uVar12);
  std::ostream::operator<<(pvVar13,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(local_18,"max base pair: ");
  pvVar13 = (void *)std::ostream::operator<<(poVar5,local_28);
  std::ostream::operator<<(pvVar13,std::endl<char,std::char_traits<char>>);
  local_238 = std::chrono::_V2::system_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)CONCAT44(in_stack_fffffffffffffbbc,iVar3),
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)CONCAT44(in_stack_fffffffffffffbb4,j_00));
  local_248.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT44(in_stack_fffffffffffffbac,_Var14));
  local_240 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_248);
  poVar5 = std::operator<<(local_18,"Time taken by program is : ");
  std::ostream::operator<<(poVar5,local_240);
  poVar5 = std::operator<<(local_18,"sec");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  m((void *)(ulong)*(uint *)(in_RSI + 0x30),0,(char *)(ulong)(*(uint *)(in_RSI + 0x30) - 1),0,2);
  std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
  operator[]((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_> *
             )(in_RSI + 0x38),(long)extraout_EAX_15);
  std::get<0ul,int,int,double>((tuple<int,_int,_double> *)0x137758);
  pvVar9 = (vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_> *)
           (in_RSI + 0x38);
  m((void *)(ulong)*(uint *)(in_RSI + 0x30),0,(char *)(ulong)(*(uint *)(in_RSI + 0x30) - 1),0,2);
  std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
  operator[](pvVar9,(long)extraout_EAX_16);
  iVar4 = (int)pvVar9;
  p_Var11 = std::get<1ul,int,int,double>((tuple<int,_int,_double> *)0x1377b0);
  _Var15 = *p_Var11;
  Access(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,iVar3,in_stack_fffffffffffffbb4,j_00,
         in_stack_fffffffffffffbac,iVar4);
  std::make_tuple<double&,std::__cxx11::string&,std::__cxx11::string&>
            ((double *)CONCAT44(in_stack_fffffffffffffbbc,iVar3),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffbb4,j_00),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffbac,_Var15));
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_200);
  return in_RDI;
}

Assistant:

tuple<double, string, string> Nussinov::nussinov(ostream &fout) {
    auto start = chrono::high_resolution_clock::now();
    fout << "Nussinov" << endl;

    double ans = 0;
    double ret = 0;
    double local_max = 0;

    // when a == b
    for (int a = 0,b; a < n; a++) {
        b=a;
        const int n_codon_a = n_codon[protein[a]];
        for (int l = 0; l < 3; l++) {
            for (int i = 0 , j; i+l < 3; i++) {
                j = i + l;
                if (sigma(b, j) - sigma(a, i) <= g) continue;
                for (int x = 0; x < n_codon_a; x++) {
                    ret = 0;
                    if (complementary(nucleotides[protein[a]][x][i], nucleotides[protein[b]][x][j])) {
                        // F [a][b][i + 1][j − 1][x][x] + 1
                        if (i <= 1 && j >= 1 && i < j - 1) {
                            ret = max(ret, Access(a, b,i + 1, j - 1, x, x) + 1);
                        }

                    }

                    //F [a][b][i + 1][j][x][x]
                    if (i <= 1 && i + 1 <= j) {
                        ret = max(ret, Access(a, b, i + 1, j, x, x));
                    }
                    //F [a][b][i][j − 1][x][x]
                    if (j >= 1 && i <= j - 1) {
                        ret = max(ret, Access(a, b, i, j - 1, x, x));
                    }

                    if (ret > get<2>(codon_index[m(n, a, b,i,j)])) {
                        codon_index[m(n,a,b,i,j)] = make_tuple(x,x,ret);
                    }
                    if (ret > get<2>(codon_index_x[m(n, a, b,i,j,x)])) {
                        codon_index_x[m(n,a,b,i,j,x)] = make_tuple(x,x,ret);
                    }
                    if (ret > get<2>(codon_index_y[m(n, a, b,i,j,x)])) {
                        codon_index_y[m(n,a,b,i,j,x)] = make_tuple(x,x,ret);
                    }
                    Access(a, b, i, j, x, x) = ret;
                }
//                cout << "a: " << a << ",b: " << b << ",i: " << i << ",j: " << j << ",index: " << (9*n*(b-a)+(3*j-2*i)) << endl;
            }
        }
    }


    for (int len = 1; len < n; len++) {
        for(int a = 0,b; a+len < n; a++){
            b=a+len;
            const int n_codon_a = n_codon[protein[a]];
            const int n_codon_b = n_codon[protein[b]];
            for (int i = 2; i >= 0; i--) {
                for (int j = 0; j < 3; j++) {
                    if (sigma(b,j) - sigma(a,i) <= g) continue;
                    for (int x = 0; x < n_codon_a; x++) {
                        for (int y = 0; y < n_codon_b; y++) {
                            ret = 0;
                            // i, j pair
                            if (complementary(nucleotides[protein[a]][x][i], nucleotides[protein[b]][y][j])) {
                                //F [a][b][i + 1][j − 1][x][y] + 1
                                if (i <= 1 && j >= 1) {
                                    ret = max(ret, Access(a, b, i + 1,j - 1,x,y) + 1);
                                }

                                if (i == 2 && j >=1) {
                                    // 1 + maxx′ ∈S(va+1){1 + F [a + 1][b][1][j − 1][x′][y]}
                                    if (a + 1 < b) {
                                        const int n_codon_an = n_codon[protein[a+1]];
                                        local_max = 0;
                                        for (int p = 0; p < n_codon_an; p++) {
                                            local_max = max(local_max, Access(a+1, b, 0, j - 1,p,y));
                                        }
                                        ret = max(ret, local_max + 1);
                                    }
                                    // 1 + F [a + 1][b][1][j − 1][y][y]
                                    if (a + 1 == b) {
                                        ret = max(ret, Access(a+1, b, 0, j-1, y, y) + 1);
                                    }
                                }

                                if (i <= 1 && j == 0) {
                                    // 1 + maxy′∈S(vb−1){F [a][b − 1][i + 1][3][x][y′]}
                                    if (a < b - 1) {
                                        const int n_codon_bp = n_codon[protein[b-1]];
                                        local_max = 0;
                                        for (int q = 0; q < n_codon_bp; q++) {
                                            local_max = max(local_max, Access(a, b-1, i + 1, 2, x, q));
                                        }
                                        ret = max(ret, local_max + 1);
                                    }
                                    // 1 + F [a][b − 1][i + 1][3][x][x]
                                    if (a == b - 1) {
                                        ret = max(ret, Access(a, b-1, i+1, 2, x, x) + 1);
                                    }
                                }

                                if (i == 2 && j == 0) {
                                    // 1 + maxx′ ∈S(va+1),y′ ∈S(vb−1){F [a + 1][b − 1][1][3][x′][y′]}
                                    if (a + 1 < b - 1) {
                                        const int n_codon_an = n_codon[protein[a+1]];
                                        const int n_codon_bp = n_codon[protein[b-1]];
                                        local_max = 0;
                                        for (int p = 0; p < n_codon_an; p++) {
                                            for (int q = 0; q < n_codon_bp; q++) {
                                                local_max = max(local_max, Access(a+1, b-1, 0,2,p,q));
                                            }
                                        }
                                        ret = max(ret, local_max + 1);
                                    }
                                    // 1 + maxx′ ∈S(va+1){F [a + 1][b − 1][1][3][x′][x′]}
                                    if (a + 1 == b - 1) {
                                        const int n_codon_an = n_codon[protein[a+1]];
                                        local_max = 0;
                                        for (int p = 0; p < n_codon_an; p++) {
                                            local_max = max(local_max, Access(a+1, b-1, 0,2,p,p));
                                        }
                                        ret = max(ret, local_max + 1);
                                    }
                                    // 1
                                    if (sigma(b,j) - 1 == sigma(a,i) + g) { //
                                        ret = max(ret, (double)1.0);
                                    }
                                }

                            }
                            // F [a][b][i + 1][j][x][y]
                            if (i <= 1) {
                                ret = max(ret, Access(a, b, i + 1,j,x,y));
                            }
                            // F [a][b][i][j − 1][x][y]
                            if (j >= 1) {
                                ret = max(ret, Access(a, b, i,j - 1,x,y));
                            }

                            if (i == 2) {
                                // maxx′ ∈S(va+1) F [a + 1][b][1][j][x′][y]
                                if (a + 1 < b) {
                                    const int n_codon_an = n_codon[protein[a+1]];
                                    for (int p = 0; p < n_codon_an; p++) {
                                        ret = max(ret, Access(a+1, b, 0, j,p,y));
                                    }
                                }
                                // F [a + 1][b][1][j][y][y]
                                if (a + 1 == b) {
                                    ret = max(ret, Access(a+1, b, 0, j, y, y));
                                }
                            }

                            if (j == 0) {
                                // maxy′ ∈S(vb−1 ) F [a][b − 1][i][3][x][y′]
                                if (a < b - 1) {
                                    const int n_codon_bp = n_codon[protein[b-1]];
                                    for (int q = 0; q < n_codon_bp; q++) {
                                        ret = max(ret, Access(a, b - 1, i, 2, x, q));
                                    }
                                }
                                // F [a][b − 1][i][3][x][x]
                                if (a == b - 1) {
                                    ret = max(ret, Access(a, b - 1, i, 2, x, x));
                                }
                            }

                            // bifurication

                            // maxa<c<b−1,y′ ∈S(vc ),x′∈S(vc+1){F [a][c][i][3][x][y′] + F [c + 1][b][1][j][x′][y]}
                            if (a < b - 2) {
                                for (int c = a + 1; c < b-1; c++) {
                                    const int n_codon_cn = n_codon[protein[c+1]];
                                    const int n_codon_c = n_codon[protein[c]];
                                    for (int p = 0; p < n_codon_cn; p++) {
                                        for (int q = 0; q < n_codon_c; q++) {
                                            ret = max(ret, Access(a,c, i,2,x,q) + Access(c + 1, b, 0,j,p,y));
                                        }
                                    }
                                }
                            }
                            // maxx′ ∈S(va+1){F [a][a][i][3][x][x] + F [a + 1][b][1][j][x′][y]}
                            if (a < b-1 && i <= 2) {
                                const int n_codon_an = n_codon[protein[a+1]];
                                for (int p = 0; p < n_codon_an; p++) {
                                    ret = max(ret, Access(a, a, i, 2, x, x) + Access(a + 1, b, 0, j, p, y));
                                }
                            }
                            // maxy′∈S(vb−1 ){F [a][b − 1][i][3][x][y′] + F [b][b][1][j][y][y]}
                            if (a < b - 1 && j >= 0) {
                                const int n_codon_bp = n_codon[protein[b-1]];
                                for (int q = 0; q < n_codon_bp; q++) {
                                    ret = max(ret, Access(a, b - 1, i, 2, x, q) + Access(b, b, 0, j, y, y));
                                }
                            }
                            // F [a][a][i][3][x][x] + F [b][b][1][j][y][y]
                            if (a == b - 1 && i <= 2 && j >= 0) {
                                ret = max(ret, Access(a, a, i, 2, x, x) + Access(b, b, 0, j, y, y));
                            }
                            // maxk<3,a<c<b,x′ ∈S(vc ){F [a][c][i][k][x][x′] + F [c][b][k + 1][j][x′][y]}
                            if (a < b - 1) {
                                for (int c = a+1; c < b; c++) {
                                    for (int k = 0; k < 2; k++) {
                                        const int n_codon_c = n_codon[protein[c]];
                                        for (int q = 0; q < n_codon_c; q++) {
                                            ret = max(ret, Access(a, c, i,k,x,q) + Access(c, b, k + 1,j,q,y));
                                        }
                                    }
                                }
                            }
                            // F [a][a][1][2][x][x] + F [a][b][3][j][x][y]
                            if (a < b && i <= 1) {
                                for (int k = i; k < 2; k++) {
                                    ret = max(ret, Access(a, a, i, k, x, x) + Access(a, b, k+1, j, x, y));
                                }
                            }
                            // F [a][b][i][1][x][y] + F [b][b][2][3][y][y]
                            if (a < b && j >= 1) {
                                for (int k = 0; k <= j - 1; k++) {
                                    ret = max(ret, Access(a, b, i, k, x, y) + Access(b, b, k+1, j, y, y));
                                }
                            }

                            if (ret > get<2>(codon_index[m(n, a, b,i,j)])) {
                                codon_index[m(n,a,b,i,j)] = make_tuple(x,y,ret);
                            }
                            if (ret > get<2>(codon_index_x[m(n, a, b,i,j,x)])) {
                                codon_index_x[m(n,a,b,i,j,x)] = make_tuple(x,y,ret);
                            }
                            if (ret > get<2>(codon_index_y[m(n, a, b,i,j,y)])) {
                                codon_index_y[m(n,a,b,i,j,y)] = make_tuple(x,y,ret);
                            }
                            Access(a, b, i, j, x, y) = ret;

                            ans = max(ans, ret);
                        }
                    }

//                    fout << "a: " << a << ",b: " << b << ",i: " << i << ",j: " << j << ",ret: " << ret << endl;
                }
            }

        }
    }


    // find rna and base pair
    string bp = find_bp(0, n-1, 0, 2, get<0>(codon_index[m(n,0,n-1,0,2)]), get<1>(codon_index[m(n,0,n-1,0,2)]), 0);
    string rna = find_bp(0, n-1, 0, 2, get<0>(codon_index[m(n,0,n-1,0,2)]), get<1>(codon_index[m(n,0,n-1,0,2)]), 1);


    fout << "corresponding base pairs: " << bp << ",length: " << bp.size() << endl;
//    fout << "corresponding base pairs (Nussinov Validation): " << nuss_bp << ",length: " << nuss_bp.size() << endl;
    fout << "corresponding rna: " << rna << ",size: " << rna.size() << endl;
//    fout << "corresponding rna2: " << rna2 << ",size: " << rna.size() << endl;
    fout << "max base pair: " << ans << endl;
//    fout << "max base pair: (Nussinov Validation): " << nuss_ans << endl;
    auto end = chrono::high_resolution_clock::now();
    long time_take = chrono::duration_cast<chrono::seconds>(end - start).count();
    fout << "Time taken by program is : " << time_take;
    fout << "sec" << endl;

    return make_tuple(Access(0, n-1, 0, 2, get<0>(codon_index[m(n,0,n-1,0,2)]), get<1>(codon_index[m(n,0,n-1,0,2)])), rna, bp); //,0,2
}